

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_base64.c
# Opt level: O0

char * uo_base64_encode(char *dst,void *src,size_t src_len)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar *puVar4;
  uchar b2;
  uchar b1;
  long lStack_38;
  uchar b0;
  uchar *b;
  uchar *a;
  uchar *end;
  size_t src_len_local;
  void *src_local;
  char *dst_local;
  
  puVar4 = (uchar *)(dst + ((src_len << 2) / 3 + 3 & 0xfffffffffffffffc));
  lStack_38 = (long)src + src_len;
  if (src_len % 3 == 1) {
    bVar1 = *(byte *)(lStack_38 + -1);
    puVar4[-1] = '=';
    puVar4[-2] = '=';
    puVar4[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(int)((bVar1 & 3) << 4)];
    puVar4[-4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(int)(uint)bVar1 >> 2];
    lStack_38 = lStack_38 + -1;
    b = puVar4 + -4;
  }
  else {
    b = puVar4;
    if (src_len % 3 == 2) {
      bVar1 = *(byte *)(lStack_38 + -1);
      bVar2 = *(byte *)(lStack_38 + -2);
      puVar4[-1] = '=';
      puVar4[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(int)((bVar1 & 0xf) << 2)];
      puVar4[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(int)((bVar2 & 3) << 4 | (int)(uint)bVar1 >> 4)];
      puVar4[-4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(int)(uint)bVar2 >> 2];
      lStack_38 = lStack_38 + -2;
      b = puVar4 + -4;
    }
  }
  while (dst < b) {
    bVar1 = *(byte *)(lStack_38 + -1);
    bVar2 = *(byte *)(lStack_38 + -2);
    bVar3 = *(byte *)(lStack_38 + -3);
    b[-1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(int)(bVar1 & 0x3f)];
    b[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
            [(int)((bVar2 & 0xf) << 2 | (int)(uint)bVar1 >> 6)];
    b[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
            [(int)((bVar3 & 3) << 4 | (int)(uint)bVar2 >> 4)];
    b[-4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
            [(int)(uint)bVar3 >> 2];
    lStack_38 = lStack_38 + -3;
    b = b + -4;
  }
  return (char *)puVar4;
}

Assistant:

char *uo_base64_encode(
    char *dst, 
    const void *src, 
    size_t src_len)
{
    unsigned char *end = dst + ((src_len * 4 / 3 + 3) & ~3);
    unsigned char *a = end;
    const unsigned char *b = (unsigned char *)src + src_len;
    unsigned char b0, b1, b2;

    switch (src_len % 3)
    {
        case 1:
            b0 = *--b;

            *--a = '=';
            *--a = '=';
            *--a = btoa[(b0 & 0x03) << 4];
            *--a = btoa[b0 >> 2];

            break;

        case 2:
            b1 = *--b;
            b0 = *--b;
            
            *--a = '=';
            *--a = btoa[(b1 & 0x0F) << 2];
            *--a = btoa[(b0 & 0x03) << 4 | b1 >> 4];
            *--a = btoa[b0 >> 2];

            break;
    }

    while ((char *)a > dst)
    {
        b2 = *--b;
        b1 = *--b;
        b0 = *--b;
        
        *--a = btoa[b2 & 0x3F];
        *--a = btoa[(b1 & 0x0F) << 2 | b2 >> 6];
        *--a = btoa[(b0 & 0x03) << 4 | b1 >> 4];
        *--a = btoa[b0 >> 2];
    }

    return end;
}